

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::VertexIDCase::renderReference
          (VertexIDCase *this,PixelBufferAccess *dst,int numVertices,deUint16 *indices,
          Vec4 *positions,Vec4 *colors)

{
  Renderer referenceRenderer;
  VertexAttrib attribs [2];
  VertexIDReferenceShader referenceShader;
  RenderTarget referenceTarget;
  Renderer local_355;
  int local_354;
  Program local_350;
  VertexAttrib local_338;
  undefined8 uStack_310;
  undefined8 local_308;
  Vec4 *pVStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  DrawIndices local_2e0;
  VertexIDReferenceShader local_2d0;
  DrawCommand local_260;
  RenderState local_22c;
  PrimitiveList local_148;
  RenderTarget local_128;
  
  local_354 = numVertices;
  rr::Renderer::Renderer(&local_355);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&local_2d0,dst);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_128,
             (MultisamplePixelBufferAccess *)&local_2d0);
  local_22c.cullMode = CULLMODE_NONE;
  local_22c.provokingVertexConvention = PROVOKINGVERTEX_LAST;
  local_22c.rasterization.winding = WINDING_CCW;
  local_22c.rasterization.horizontalFill = FILL_LEFT;
  local_22c.rasterization.verticalFill = FILL_BOTTOM;
  local_22c.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
  rr::FragmentOperationState::FragmentOperationState(&local_22c.fragOps);
  local_22c.point.pointSize = 1.0;
  local_22c.viewport.rect.left = 0;
  local_22c.viewport.rect.bottom = 0;
  local_22c.viewport.rect.width = local_128._12_4_;
  local_22c.viewport.rect.height = local_128._16_4_;
  local_22c.viewport.zn = 0.0;
  local_22c.viewport.zf = 1.0;
  local_22c.line.lineWidth = 1.0;
  local_22c.restart.enabled = false;
  local_22c.restart.restartIndex = 0xffffffff;
  local_22c.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  local_22c.rasterization._8_8_ = local_22c.rasterization._8_8_ & 0xffffffff;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&local_2d0,dst);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_338);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_260);
  rr::RenderTarget::RenderTarget
            (&local_128,(MultisamplePixelBufferAccess *)&local_2d0,
             (MultisamplePixelBufferAccess *)&local_338,(MultisamplePixelBufferAccess *)&local_260);
  VertexIDReferenceShader::VertexIDReferenceShader(&local_2d0);
  local_338.generic.v._0_8_ = 0;
  local_338.generic.v._8_8_ = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_338.type = VERTEXATTRIBTYPE_FLOAT;
  local_338.size = 4;
  local_338.stride = 0;
  local_338.instanceDivisor = 0;
  uStack_310 = 0x400000000;
  local_308 = 0;
  local_350.geometryShader = (GeometryShader *)0x0;
  local_350.vertexShader = &local_2d0.super_VertexShader;
  local_350.fragmentShader = &local_2d0.super_FragmentShader;
  local_338.pointer = positions;
  pVStack_300 = colors;
  rr::DrawIndices::DrawIndices(&local_2e0,indices,0);
  rr::PrimitiveList::PrimitiveList(&local_148,PRIMITIVETYPE_TRIANGLES,local_354,&local_2e0);
  local_260.state = &local_22c;
  local_260.program = &local_350;
  local_260.numVertexAttribs = 2;
  local_260.renderTarget = &local_128;
  local_260.vertexAttribs = &local_338;
  local_260.primitives = &local_148;
  rr::Renderer::draw(&local_355,&local_260);
  rr::FragmentShader::~FragmentShader(&local_2d0.super_FragmentShader);
  rr::VertexShader::~VertexShader(&local_2d0.super_VertexShader);
  rr::Renderer::~Renderer(&local_355);
  return;
}

Assistant:

void VertexIDCase::renderReference (const tcu::PixelBufferAccess& dst, const int numVertices, const deUint16* const indices, const tcu::Vec4* const positions, const tcu::Vec4* const colors)
{
	const rr::Renderer				referenceRenderer;
	const rr::RenderState			referenceState		((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst)));
	const rr::RenderTarget			referenceTarget		(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst));
	const VertexIDReferenceShader	referenceShader;
	      rr::VertexAttrib			attribs[2];

	attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[0].size				= 4;
	attribs[0].stride			= 0;
	attribs[0].instanceDivisor	= 0;
	attribs[0].pointer			= positions;

	attribs[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[1].size				= 4;
	attribs[1].stride			= 0;
	attribs[1].instanceDivisor	= 0;
	attribs[1].pointer			= colors;

	referenceRenderer.draw(
		rr::DrawCommand(
			referenceState,
			referenceTarget,
			rr::Program(&referenceShader, &referenceShader),
			2,
			attribs,
			rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, numVertices, rr::DrawIndices(indices))));
}